

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O2

void run_static_context_tests(int use_prealloc)

{
  int iVar1;
  size_t i;
  size_t sVar2;
  void *__s;
  secp256k1_context *psVar3;
  long lVar4;
  undefined8 uVar5;
  secp256k1_context *psVar6;
  char *pcVar7;
  uchar *p;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar seed [32];
  
  if (secp256k1_context_no_precomp != secp256k1_context_static) {
    pcVar7 = "test condition failed: secp256k1_context_no_precomp == secp256k1_context_static";
    uVar5 = 200;
    goto LAB_0011c7bb;
  }
  seed[0x10] = '\0';
  seed[0x11] = '\0';
  seed[0x12] = '\0';
  seed[0x13] = '\0';
  seed[0x14] = '\0';
  seed[0x15] = '\0';
  seed[0x16] = '\0';
  seed[0x17] = '\0';
  seed[0x18] = '\0';
  seed[0x19] = '\0';
  seed[0x1a] = '\0';
  seed[0x1b] = '\0';
  seed[0x1c] = '\0';
  seed[0x1d] = '\0';
  seed[0x1e] = '\0';
  seed[0x1f] = '\0';
  _calls_to_callback = 0;
  seed[0] = '\x17';
  seed[1] = '\0';
  seed[2] = '\0';
  seed[3] = '\0';
  seed[4] = '\0';
  seed[5] = '\0';
  seed[6] = '\0';
  seed[7] = '\0';
  seed[8] = '\0';
  seed[9] = '\0';
  seed[10] = '\0';
  seed[0xb] = '\0';
  seed[0xc] = '\0';
  seed[0xd] = '\0';
  seed[0xe] = '\0';
  seed[0xf] = '\0';
  _saved_callback.fn = (STATIC_CTX->illegal_callback).fn;
  _saved_callback.data = (STATIC_CTX->illegal_callback).data;
  secp256k1_context_set_illegal_callback(STATIC_CTX,counting_callback_fn,&_calls_to_callback);
  iVar1 = secp256k1_context_randomize(STATIC_CTX,seed);
  psVar6 = STATIC_CTX;
  if (iVar1 == 0) {
    (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
    (psVar6->illegal_callback).data = _saved_callback.data;
    if (_calls_to_callback == 1) {
      _calls_to_callback = 0;
      _saved_callback.fn = (psVar6->illegal_callback).fn;
      _saved_callback.data = (psVar6->illegal_callback).data;
      secp256k1_context_set_illegal_callback(psVar6,counting_callback_fn,&_calls_to_callback);
      iVar1 = secp256k1_context_randomize(STATIC_CTX,(uchar *)0x0);
      psVar6 = STATIC_CTX;
      if (iVar1 == 0) {
        (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
        (psVar6->illegal_callback).data = _saved_callback.data;
        if (_calls_to_callback == 1) {
          if (use_prealloc == 0) {
            _calls_to_callback = 0;
            _saved_callback.fn = (psVar6->illegal_callback).fn;
            _saved_callback.data = (psVar6->illegal_callback).data;
            secp256k1_context_set_illegal_callback(psVar6,counting_callback_fn,&_calls_to_callback);
            psVar3 = secp256k1_context_clone(STATIC_CTX);
            psVar6 = STATIC_CTX;
            if (psVar3 == (secp256k1_context *)0x0) {
              (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
              (psVar6->illegal_callback).data = _saved_callback.data;
              if (_calls_to_callback == 1) {
                _calls_to_callback = 0;
                _saved_callback.fn = (psVar6->illegal_callback).fn;
                _saved_callback.data = (psVar6->illegal_callback).data;
                secp256k1_context_set_illegal_callback
                          (psVar6,counting_callback_fn,&_calls_to_callback);
                secp256k1_context_destroy(STATIC_CTX);
                psVar6 = STATIC_CTX;
                (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
                (psVar6->illegal_callback).data = _saved_callback.data;
                if (_calls_to_callback == 1) {
LAB_0011c4c1:
                  seed._0_8_ = seed._0_8_ & 0xffffffff00000000;
                  secp256k1_context_set_illegal_callback(psVar6,counting_callback_fn,seed);
                  if ((STATIC_CTX->illegal_callback).fn == counting_callback_fn) {
                    if ((uchar *)(STATIC_CTX->illegal_callback).data == seed) {
                      secp256k1_context_set_illegal_callback
                                (STATIC_CTX,(_func_void_char_ptr_void_ptr *)0x0,(void *)0x0);
                      if ((STATIC_CTX->illegal_callback).fn == secp256k1_default_illegal_callback_fn
                         ) {
                        if ((STATIC_CTX->illegal_callback).data == (void *)0x0) {
                          return;
                        }
                        pcVar7 = "test condition failed: STATIC_CTX->illegal_callback.data == NULL";
                        uVar5 = 0xeb;
                      }
                      else {
                        pcVar7 = 
                        "test condition failed: STATIC_CTX->illegal_callback.fn == secp256k1_default_illegal_callback_fn"
                        ;
                        uVar5 = 0xea;
                      }
                    }
                    else {
                      pcVar7 = "test condition failed: STATIC_CTX->illegal_callback.data == &dummy";
                      uVar5 = 0xe8;
                    }
                  }
                  else {
                    pcVar7 = 
                    "test condition failed: STATIC_CTX->illegal_callback.fn == counting_callback_fn"
                    ;
                    uVar5 = 0xe7;
                  }
                }
                else {
                  pcVar7 = "test condition failed: _calls_to_callback == 1";
                  uVar5 = 0xdf;
                }
                goto LAB_0011c7bb;
              }
              pcVar7 = "test condition failed: _calls_to_callback == 1";
            }
            else {
              pcVar7 = "test condition failed: (secp256k1_context_clone(STATIC_CTX)) == 0";
            }
            uVar5 = 0xde;
            goto LAB_0011c7bb;
          }
          _calls_to_callback = 0;
          _saved_callback.fn = (psVar6->illegal_callback).fn;
          _saved_callback.data = (psVar6->illegal_callback).data;
          secp256k1_context_set_illegal_callback(psVar6,counting_callback_fn,&_calls_to_callback);
          sVar2 = secp256k1_context_preallocated_clone_size(STATIC_CTX);
          psVar6 = STATIC_CTX;
          if (sVar2 == 0) {
            (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
            (psVar6->illegal_callback).data = _saved_callback.data;
            if (_calls_to_callback == 1) {
              __s = malloc(0xe8);
              if (__s == (void *)0x0) {
                pcVar7 = "test condition failed: my_static_ctx != NULL";
                uVar5 = 0xd6;
              }
              else {
                memset(__s,0x2a,0xe8);
                _calls_to_callback = 0;
                _saved_callback.fn = (psVar6->illegal_callback).fn;
                _saved_callback.data = (psVar6->illegal_callback).data;
                secp256k1_context_set_illegal_callback
                          (psVar6,counting_callback_fn,&_calls_to_callback);
                psVar3 = secp256k1_context_preallocated_clone(STATIC_CTX,__s);
                psVar6 = STATIC_CTX;
                if (psVar3 == (secp256k1_context *)0x0) {
                  (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
                  (psVar6->illegal_callback).data = _saved_callback.data;
                  if (_calls_to_callback == 1) {
                    lVar4 = 0;
                    do {
                      if (lVar4 == 0xe8) {
                        free(__s);
                        _calls_to_callback = 0;
                        _saved_callback.fn = (psVar6->illegal_callback).fn;
                        _saved_callback.data = (psVar6->illegal_callback).data;
                        secp256k1_context_set_illegal_callback
                                  (psVar6,counting_callback_fn,&_calls_to_callback);
                        secp256k1_context_preallocated_destroy(STATIC_CTX);
                        psVar6 = STATIC_CTX;
                        (STATIC_CTX->illegal_callback).fn = _saved_callback.fn;
                        (psVar6->illegal_callback).data = _saved_callback.data;
                        if (_calls_to_callback == 1) goto LAB_0011c4c1;
                        pcVar7 = "test condition failed: _calls_to_callback == 1";
                        uVar5 = 0xdc;
                        goto LAB_0011c7bb;
                      }
                      pcVar7 = (char *)((long)__s + lVar4);
                      lVar4 = lVar4 + 1;
                    } while (*pcVar7 == '*');
                    pcVar7 = 
                    "test condition failed: all_bytes_equal(my_static_ctx, 0x2a, sizeof(*my_static_ctx))"
                    ;
                    uVar5 = 0xd9;
                    goto LAB_0011c7bb;
                  }
                  pcVar7 = "test condition failed: _calls_to_callback == 1";
                }
                else {
                  pcVar7 = 
                  "test condition failed: (secp256k1_context_preallocated_clone(STATIC_CTX, my_static_ctx)) == 0"
                  ;
                }
                uVar5 = 0xd8;
              }
              goto LAB_0011c7bb;
            }
            pcVar7 = "test condition failed: _calls_to_callback == 1";
          }
          else {
            pcVar7 = 
            "test condition failed: (secp256k1_context_preallocated_clone_size(STATIC_CTX)) == 0";
          }
          uVar5 = 0xd3;
          goto LAB_0011c7bb;
        }
        pcVar7 = "test condition failed: _calls_to_callback == 1";
      }
      else {
        pcVar7 = "test condition failed: (secp256k1_context_randomize(STATIC_CTX, ((void*)0))) == 0"
        ;
      }
      uVar5 = 0xcf;
      goto LAB_0011c7bb;
    }
    pcVar7 = "test condition failed: _calls_to_callback == 1";
  }
  else {
    pcVar7 = "test condition failed: (secp256k1_context_randomize(STATIC_CTX, seed)) == 0";
  }
  uVar5 = 0xce;
LAB_0011c7bb:
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/fanquake[P]bitcoin/src/secp256k1/src/tests.c"
          ,uVar5,pcVar7);
  abort();
}

Assistant:

static void run_static_context_tests(int use_prealloc) {
    /* Check that deprecated secp256k1_context_no_precomp is an alias to secp256k1_context_static. */
    CHECK(secp256k1_context_no_precomp == secp256k1_context_static);

    {
        unsigned char seed[32] = {0x17};

        /* Randomizing secp256k1_context_static is not supported. */
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, seed));
        CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_randomize(STATIC_CTX, NULL));

        /* Destroying or cloning secp256k1_context_static is not supported. */
        if (use_prealloc) {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone_size(STATIC_CTX));
            {
                secp256k1_context *my_static_ctx = malloc(sizeof(*STATIC_CTX));
                CHECK(my_static_ctx != NULL);
                memset(my_static_ctx, 0x2a, sizeof(*my_static_ctx));
                CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_preallocated_clone(STATIC_CTX, my_static_ctx));
                CHECK(all_bytes_equal(my_static_ctx, 0x2a, sizeof(*my_static_ctx)));
                free(my_static_ctx);
            }
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_preallocated_destroy(STATIC_CTX));
        } else {
            CHECK_ILLEGAL(STATIC_CTX, secp256k1_context_clone(STATIC_CTX));
            CHECK_ILLEGAL_VOID(STATIC_CTX, secp256k1_context_destroy(STATIC_CTX));
        }
    }

    {
        /* Verify that setting and resetting illegal callback works */
        int32_t dummy = 0;
        secp256k1_context_set_illegal_callback(STATIC_CTX, counting_callback_fn, &dummy);
        CHECK(STATIC_CTX->illegal_callback.fn == counting_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == &dummy);
        secp256k1_context_set_illegal_callback(STATIC_CTX, NULL, NULL);
        CHECK(STATIC_CTX->illegal_callback.fn == secp256k1_default_illegal_callback_fn);
        CHECK(STATIC_CTX->illegal_callback.data == NULL);
    }
}